

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerlaw_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::powerlaw_dist<long_double>::operator()(powerlaw_dist<long_double> *this,lcg64_shift *r)

{
  result_type_conflict3 *extraout_RAX;
  param_type *in_RSI;
  param_type *in_RDI;
  double extraout_XMM0_Qa;
  double __x;
  double in_XMM1_Qa;
  
  param_type::theta(&in_RDI->gamma_,in_RSI);
  utility::uniformoc<long_double,trng::lcg64_shift>((lcg64_shift *)0x371e4b);
  __x = param_type::gamma(in_RDI,extraout_XMM0_Qa);
  std::pow(__x,in_XMM1_Qa);
  return extraout_RAX;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(utility::uniformoc<result_type>(r), -1 / P.gamma());
    }